

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O0

void just::test::display<char_const*>(ostream *out_,char **t_)

{
  char **t__local;
  ostream *out__local;
  
  std::operator<<(out_,*t_);
  return;
}

Assistant:

void display(std::ostream& out_, const T& t_)
    {
      out_ << t_;
    }